

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

znzFile nifti_image_open(char *hname,char *opts,nifti_image **nim)

{
  char *path;
  int use_compression;
  nifti_image *pnVar1;
  char *local_60;
  char *local_40;
  znzFile fptr;
  nifti_image **nim_local;
  char *opts_local;
  char *hname_local;
  
  pnVar1 = nifti_image_read(hname,0);
  *nim = pnVar1;
  if ((((*nim == (nifti_image *)0x0) || ((*nim)->iname == (char *)0x0)) || ((*nim)->nbyper < 1)) ||
     ((*nim)->nvox == 0)) {
    local_40 = hname;
    if (hname == (char *)0x0) {
      local_40 = "(null)";
    }
    fprintf(_stderr,"** ERROR: nifti_image_open(%s): %s\n",local_40,"bad header info");
    hname_local = (char *)0x0;
  }
  else {
    path = (*nim)->iname;
    use_compression = nifti_is_gzfile((*nim)->iname);
    hname_local = (char *)znzopen(path,opts,use_compression);
    if ((znzFile)hname_local == (znzFile)0x0) {
      local_60 = hname;
      if (hname == (char *)0x0) {
        local_60 = "(null)";
      }
      fprintf(_stderr,"** ERROR: nifti_image_open(%s): %s\n",local_60,"Can\'t open data file");
    }
  }
  return (znzFile)hname_local;
}

Assistant:

znzFile nifti_image_open(const char * hname, char * opts, nifti_image ** nim)
{
  znzFile fptr=NULL;
  /* open the hdr and reading it in, but do not load the data  */
  *nim = nifti_image_read(hname,0);
  /* open the image file, ready for reading (compressed works for all reads) */
  if( ((*nim) == NULL)      || ((*nim)->iname == NULL) ||
      ((*nim)->nbyper <= 0) || ((*nim)->nvox <= 0)       )
     ERREX("bad header info") ;

  /* open image data file */
  fptr = znzopen( (*nim)->iname, opts, nifti_is_gzfile((*nim)->iname) );
  if( znz_isnull(fptr) ) ERREX("Can't open data file") ;

  return fptr;
}